

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::~PerfEventConfig_CallstackSampling
          (PerfEventConfig_CallstackSampling *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false> _Var3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__PerfEventConfig_CallstackSampling_003c7708;
  pcVar2 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar1 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->scope_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::PerfEventConfig_Scope,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
       .super__Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (PerfEventConfig_Scope *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_CppMessageObj + 8))();
  }
  (this->scope_).ptr_._M_t.
  super___uniq_ptr_impl<perfetto::protos::gen::PerfEventConfig_Scope,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_std::default_delete<perfetto::protos::gen::PerfEventConfig_Scope>_>
  .super__Head_base<0UL,_perfetto::protos::gen::PerfEventConfig_Scope_*,_false>._M_head_impl =
       (PerfEventConfig_Scope *)0x0;
  return;
}

Assistant:

PerfEventConfig_CallstackSampling::~PerfEventConfig_CallstackSampling() = default;